

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIR.h
# Opt level: O2

void __thiscall
OpenMPDeclareReductionDirective::addTypenameList
          (OpenMPDeclareReductionDirective *this,char *_typename_list)

{
  char *local_8;
  
  local_8 = _typename_list;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back(&this->typename_list,&local_8)
  ;
  return;
}

Assistant:

void setIdentifier (std::string _identifier) { identifier = _identifier;}